

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

string * __thiscall
pbrt::SquareMatrix<2>::ToString_abi_cxx11_(string *__return_storage_ptr__,SquareMatrix<2> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  string ret;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  long local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[ [","");
  lVar2 = 0;
  do {
    lVar3 = 0;
    local_38 = lVar2;
    do {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      detail::stringPrintfRecursive<float_const&>
                (&local_60," %f",(float *)((long)*(Float (*) [2])*(Float (*) [2])this + lVar3));
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      if (lVar3 == 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      lVar1 = local_38;
      lVar3 = lVar3 + 4;
    } while (lVar3 == 4);
    if (local_38 == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    lVar2 = lVar1 + 1;
    this = (SquareMatrix<2> *)((long)this + 8);
  } while (lVar1 == 0);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SquareMatrix<N>::ToString() const {
    std::string s = "[ [";
    for (int i = 0; i < N; ++i) {
        for (int j = 0; j < N; ++j) {
            s += StringPrintf(" %f", m[i][j]);
            if (j < N - 1)
                s += ',';
            else
                s += " ]";
        }
        if (i < N - 1)
            s += ", [";
    }
    s += " ]";
    return s;
}